

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

void __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
::save(DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
       *this,locType *offset)

{
  locType *in_RDI;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *unaff_retaddr;
  
  LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::
  dirty_page_set(unaff_retaddr,in_RDI);
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}